

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_ds.h
# Opt level: O2

char * stbds_stralloc(stbds_string_arena *a,char *str)

{
  ulong __n;
  size_t sVar1;
  stbds_string_block *psVar2;
  stbds_string_block *psVar3;
  char *pcVar4;
  ulong uVar5;
  
  sVar1 = strlen(str);
  __n = sVar1 + 1;
  uVar5 = a->remaining;
  if (uVar5 < __n) {
    uVar5 = 0x200L << (a->block >> 1 & 0x3f);
    if (uVar5 < 0x100000) {
      a->block = a->block + 1;
    }
    if (uVar5 < __n) {
      psVar2 = (stbds_string_block *)malloc(sVar1 + 9);
      memcpy(psVar2->storage,str,__n);
      psVar3 = a->storage;
      if (psVar3 == (stbds_string_block *)0x0) {
        psVar2->next = (stbds_string_block *)0x0;
        a->storage = psVar2;
        a->remaining = 0;
      }
      else {
        psVar2->next = psVar3->next;
        psVar3->next = psVar2;
      }
      return psVar2->storage;
    }
    psVar3 = (stbds_string_block *)malloc(uVar5 | 8);
    psVar3->next = a->storage;
    a->storage = psVar3;
  }
  else {
    psVar3 = a->storage;
  }
  a->remaining = uVar5 - __n;
  pcVar4 = (char *)memmove(psVar3->storage + ~sVar1 + uVar5,str,__n);
  return pcVar4;
}

Assistant:

char *stbds_stralloc(stbds_string_arena *a, char *str)
{
  char *p;
  size_t len = strlen(str)+1;
  if (len > a->remaining) {
    // compute the next blocksize
    size_t blocksize = a->block;

    // size is 512, 512, 1024, 1024, 2048, 2048, 4096, 4096, etc., so that
    // there are log(SIZE) allocations to free when we destroy the table
    blocksize = (size_t) (STBDS_STRING_ARENA_BLOCKSIZE_MIN) << (blocksize>>1);

    // if size is under 1M, advance to next blocktype
    if (blocksize < (size_t)(STBDS_STRING_ARENA_BLOCKSIZE_MAX))
      ++a->block;

    if (len > blocksize) {
      // if string is larger than blocksize, then just allocate the full size.
      // note that we still advance string_block so block size will continue
      // increasing, so e.g. if somebody only calls this with 1000-long strings,
      // eventually the arena will start doubling and handling those as well
      stbds_string_block *sb = (stbds_string_block *) STBDS_REALLOC(NULL, 0, sizeof(*sb)-8 + len);
      memmove(sb->storage, str, len);
      if (a->storage) {
        // insert it after the first element, so that we don't waste the space there
        sb->next = a->storage->next;
        a->storage->next = sb;
      } else {
        sb->next = 0;
        a->storage = sb;
        a->remaining = 0; // this is redundant, but good for clarity
      }
      return sb->storage;
    } else {
      stbds_string_block *sb = (stbds_string_block *) STBDS_REALLOC(NULL, 0, sizeof(*sb)-8 + blocksize);
      sb->next = a->storage;
      a->storage = sb;
      a->remaining = blocksize;
    }
  }

  STBDS_ASSERT(len <= a->remaining);
  p = a->storage->storage + a->remaining - len;
  a->remaining -= len;
  memmove(p, str, len);
  return p;
}